

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_api.c
# Opt level: O3

MPP_RET avsd_reset(void *decoder)

{
  if (((byte)avsd_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avsd_api","In.","avsd_reset");
  }
  avsd_reset_parameters((AvsdCtx_t *)decoder);
  *(undefined8 *)((long)decoder + 0x16c) = 0;
  *(undefined4 *)((long)decoder + 0x174) = 0;
  *(undefined4 *)((long)decoder + 0x180) = 0;
  *(undefined1 *)((long)decoder + 0x48) = 0;
  *(undefined4 *)((long)decoder + 0x70) = 0;
  *(undefined8 *)((long)decoder + 0x164) = 0xffffffff;
  mpp_packet_set_length(*(MppPacket *)((long)decoder + 0x10),0);
  mpp_packet_set_flag(*(MppPacket *)((long)decoder + 0x10),0);
  if (((byte)avsd_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avsd_api","Out.","avsd_reset");
  }
  return MPP_OK;
}

Assistant:

static MPP_RET avsd_reset(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdCtx_t *p_dec = (AvsdCtx_t *)decoder;

    AVSD_PARSE_TRACE("In.");

    avsd_reset_parameters(p_dec);
    p_dec->got_vsh = 0;
    p_dec->got_ph = 0;
    p_dec->got_keyframe = 0;
    p_dec->vec_flag = 0;
    p_dec->got_eos = 0;
    p_dec->left_length = 0;
    p_dec->state = 0xFFFFFFFF;
    p_dec->vop_header_found = 0;

    mpp_packet_set_length(p_dec->task_pkt, 0);
    mpp_packet_set_flag(p_dec->task_pkt, 0);

    AVSD_PARSE_TRACE("Out.");

    return ret = MPP_OK;
}